

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O3

void __thiscall rw::Geometry::addMorphTargets(Geometry *this,int32 n)

{
  int iVar1;
  uint uVar2;
  MorphTarget *pMVar3;
  V3d **ppVVar4;
  int iVar5;
  MorphTarget *pMVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  
  if (n != 0) {
    iVar9 = 0x28;
    if ((this->flags >> 0x18 & 1) == 0) {
      uVar7 = this->numVertices * 0xc;
      iVar9 = ((int)(this->flags << 0x1b) >> 0x1f & uVar7) + uVar7 + 0x28;
    }
    uVar7 = n + this->numMorphTargets;
    if (this->numMorphTargets == 0) {
      allocLocation =
           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp line: 323"
      ;
      pMVar3 = (MorphTarget *)(*DAT_00149858)((long)(int)(iVar9 * uVar7),0x3000f);
      this->morphTargets = pMVar3;
    }
    else {
      allocLocation =
           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp line: 314"
      ;
      pMVar3 = (MorphTarget *)(*DAT_00149860)(this->morphTargets,(long)(int)(iVar9 * uVar7),0x3000f)
      ;
      this->morphTargets = pMVar3;
      iVar1 = this->numMorphTargets;
      iVar5 = (iVar9 + -0x28) * iVar1;
      if (iVar5 != 0) {
        pMVar6 = pMVar3;
        do {
          pMVar6 = (MorphTarget *)((long)&pMVar6[-1].normals + 7);
          *(undefined1 *)((long)&pMVar6->parent + (long)(int)(iVar9 * uVar7)) =
               *(undefined1 *)((long)&pMVar6->parent + (long)(iVar1 * iVar9));
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
    }
    if (0 < (int)uVar7) {
      pMVar6 = pMVar3 + uVar7;
      iVar9 = this->numMorphTargets;
      uVar2 = this->flags;
      iVar1 = this->numVertices;
      ppVVar4 = &pMVar3->normals;
      uVar8 = 0;
      do {
        ((MorphTarget *)(ppVVar4 + -4))->parent = this;
        ppVVar4[-1] = (V3d *)0x0;
        *ppVVar4 = (V3d *)0x0;
        if (iVar9 <= (int)uVar8) {
          (((Sphere *)(ppVVar4 + -3))->center).x = 0.0;
          (((Sphere *)(ppVVar4 + -3))->center).y = 0.0;
          ppVVar4[-2] = (V3d *)0x0;
        }
        if (iVar1 != 0 && (uVar2 & 0x1000000) == 0) {
          ppVVar4[-1] = (V3d *)pMVar6;
          pMVar6 = (MorphTarget *)((long)&pMVar6->parent + (long)iVar1 * 0xc);
          if ((uVar2 & 0x10) != 0) {
            *ppVVar4 = (V3d *)pMVar6;
            pMVar6 = (MorphTarget *)((long)&pMVar6->parent + (long)iVar1 * 0xc);
          }
        }
        uVar8 = uVar8 + 1;
        ppVVar4 = ppVVar4 + 5;
      } while (uVar7 != uVar8);
    }
    this->numMorphTargets = uVar7;
  }
  return;
}

Assistant:

void
Geometry::addMorphTargets(int32 n)
{
	if(n == 0)
		return;
	n += this->numMorphTargets;

	int32 sz;
	sz = sizeof(MorphTarget);
	if(!(this->flags & NATIVE)){
		sz += this->numVertices*sizeof(V3d);
		if(this->flags & NORMALS)
			sz += this->numVertices*sizeof(V3d);
	}

	// Memory layout: MorphTarget[n]; (vertices and normals)[n]
	MorphTarget *mts;
	if(this->numMorphTargets){
		mts = (MorphTarget*)rwResize(this->morphTargets, n*sz, MEMDUR_EVENT | ID_GEOMETRY);
		this->morphTargets = mts;
		// Since we now have more morph targets than before, move the vertex data up
		uint8 *src = (uint8*)mts + sz*this->numMorphTargets;
		uint8 *dst = (uint8*)mts + sz*n;
		uint32 len = (sz-sizeof(MorphTarget))*this->numMorphTargets;
		while(len--)
			*--dst = *--src;
	}else{
		mts = (MorphTarget*)rwNew(n*sz, MEMDUR_EVENT | ID_GEOMETRY);
		this->morphTargets = mts;
	}

	// Set up everything and initialize the bounding sphere for new morph targets
	V3d *data  = (V3d*)&mts[n];
	for(int32 i = 0; i < n; i++){
		mts->parent = this;
		mts->vertices = nil;
		mts->normals = nil;
		if(i >= this->numMorphTargets){
			mts->boundingSphere.center.x = 0.0f;
			mts->boundingSphere.center.y = 0.0f;
			mts->boundingSphere.center.z = 0.0f;
			mts->boundingSphere.radius = 0.0f;
		}
		if(!(this->flags & NATIVE) && this->numVertices){
			mts->vertices = data;
			data += this->numVertices;
			if(this->flags & NORMALS){
				mts->normals = data;
				data += this->numVertices;
			}
		}
		mts++;
	}
	this->numMorphTargets = n;
}